

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

ssize_t __thiscall higan::HttpContext::ParseFirstLine(HttpContext *this,char *begin,char *end)

{
  bool bVar1;
  char *end_00;
  char *end_01;
  char *end_02;
  char *pcVar2;
  
  end_00 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (begin,end,CRLF,CRLF + CRLF_LEN);
  if (end_00 == end) {
    pcVar2 = (char *)0x0;
  }
  else {
    end_01 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (begin,end_00);
    pcVar2 = (char *)0xffffffffffffffff;
    if (end_01 != end_00) {
      bVar1 = HttpRequest::SetMethod(&this->request_,begin,end_01);
      if (bVar1) {
        end_02 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (end_01 + 1,end_00);
        if (end_02 != end_00) {
          bVar1 = HttpRequest::SetUrl(&this->request_,end_01 + 1,end_02);
          if ((bVar1) && ((long)end_00 - (long)end_02 == 9)) {
            bVar1 = HttpRequest::SetVersion(&this->request_,end_02 + 1,end_00);
            if (bVar1) {
              this->status_ = PARSE_HEADERS;
              pcVar2 = end_00 + (CRLF_LEN - (long)begin);
            }
          }
        }
      }
    }
  }
  return (ssize_t)pcVar2;
}

Assistant:

ssize_t HttpContext::ParseFirstLine(const char* begin, const char* end)
{
	// GET /hello.html HTTP/1.1\r\n

	const char* first_line_end = std::search(begin, end, CRLF, CRLF + CRLF_LEN);
	CHECK_IF_RETURN(first_line_end == end, true, 0);

	// GET
	const char* method_end = std::find(begin, first_line_end, ' ');
	CHECK_IF_RETURN(method_end == first_line_end, true, -1);
	CHECK_IF_RETURN(request_.SetMethod(begin, method_end), false, -1);


	// /hello.html
	const char* url_end = std::find(method_end + 1, first_line_end, ' ');
	CHECK_IF_RETURN(url_end == first_line_end, true, -1);
	CHECK_IF_RETURN(request_.SetUrl(method_end + 1, url_end), false, -1);


	CHECK_IF_RETURN(first_line_end - url_end != 9, true, -1);
	// HTTP/1.1
	CHECK_IF_RETURN(request_.SetVersion(url_end + 1, first_line_end), false, -1);


	status_ = PARSE_HEADERS;
	return first_line_end - begin + CRLF_LEN;
}